

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O3

void __thiscall Gluco::Solver::reduceDB(Solver *this)

{
  ClauseAllocator *lt;
  Clause *c;
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  uint *puVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  char *__function;
  long lVar9;
  int iVar10;
  char *__file;
  char *__assertion;
  long lVar11;
  int iVar12;
  
  this->nbReduceDB = this->nbReduceDB + 1;
  lt = &this->ca;
  sort<unsigned_int,reduceDB_lt>((this->learnts).data,(this->learnts).sz,(reduceDB_lt)lt);
  iVar12 = (this->learnts).sz;
  iVar10 = iVar12 / 2;
  puVar4 = (this->learnts).data;
  uVar1 = puVar4[iVar10];
  uVar2 = (this->ca).super_RegionAllocator<unsigned_int>.sz;
  if (uVar1 < uVar2) {
    puVar5 = (lt->super_RegionAllocator<unsigned_int>).memory;
    if ((puVar5[uVar1] & 0x7fffff80) == 0) {
      this->nbclausesbeforereduce = this->nbclausesbeforereduce + this->specialIncReduceDB;
    }
    uVar1 = puVar4[(long)iVar12 + -1];
    if (uVar1 < uVar2) {
      if ((puVar5[uVar1] & 0x7fffffc0) < 0xc0) {
        this->nbclausesbeforereduce = this->nbclausesbeforereduce + this->specialIncReduceDB;
      }
      if (iVar12 < 1) {
        if (-1 < iVar12) goto LAB_005c2f10;
      }
      else {
        lVar11 = 0;
        iVar12 = 0;
        do {
          uVar1 = (this->learnts).data[lVar11];
          if ((this->ca).super_RegionAllocator<unsigned_int>.sz <= uVar1) goto LAB_005c2f5a;
          c = (Clause *)((lt->super_RegionAllocator<unsigned_int>).memory + uVar1);
          uVar7 = *(ulong *)&c->header;
          uVar8 = uVar7 & 0x80000000;
          if (((uVar8 == 0) || (((uint)uVar7 & 0x7fffffe0) < 0x41)) || ((int)(uVar7 >> 0x20) < 3)) {
LAB_005c2eb3:
            iVar10 = iVar10 + (uint)(uVar8 == 0);
            *(ulong *)&c->header = uVar7 | 0x80000000;
            puVar4 = (this->learnts).data;
            lVar9 = (long)iVar12;
            iVar12 = iVar12 + 1;
            puVar4[lVar9] = puVar4[lVar11];
          }
          else {
            bVar6 = locked(this,c);
            if ((bVar6) || (iVar10 <= lVar11)) {
              uVar7 = *(ulong *)&c->header;
              uVar8 = (ulong)((uint)uVar7 & 0x80000000);
              goto LAB_005c2eb3;
            }
            removeClause(this,(this->learnts).data[lVar11]);
            this->nbRemovedClauses = this->nbRemovedClauses + 1;
          }
          lVar11 = lVar11 + 1;
          iVar3 = (this->learnts).sz;
        } while (lVar11 < iVar3);
        iVar10 = (int)lVar11 - iVar12;
        if (iVar10 <= iVar3) {
          if (0 < iVar10) {
            (this->learnts).sz = (iVar12 + iVar3) - (int)lVar11;
          }
LAB_005c2f10:
          if ((double)(this->ca).super_RegionAllocator<unsigned_int>.sz * this->garbage_frac <
              (double)(this->ca).super_RegionAllocator<unsigned_int>.wasted_) {
            (*this->_vptr_Solver[3])(this);
            return;
          }
          return;
        }
      }
      __assertion = "nelems <= sz";
      __file = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Vec.h";
      __function = "void Gluco::vec<unsigned int>::shrink(int) [T = unsigned int]";
      goto LAB_005c2f6f;
    }
  }
LAB_005c2f5a:
  __assertion = "r >= 0 && r < sz";
  __file = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Alloc.h";
  __function = "T &Gluco::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]";
LAB_005c2f6f:
  __assert_fail(__assertion,__file,0x42,__function);
}

Assistant:

void Solver::reduceDB()
{ 
  int i, j;
  nbReduceDB++;
  sort(learnts, reduceDB_lt(ca));

  // We have a lot of "good" clauses, it is difficult to compare them. Keep more !
  if(ca[learnts[learnts.size() / RATIOREMOVECLAUSES]].lbd()<=3) nbclausesbeforereduce +=specialIncReduceDB; 
  // Useless :-)
  if(ca[learnts.last()].lbd()<=5)  nbclausesbeforereduce +=specialIncReduceDB;   
  
  // Don't delete binary or locked clauses. From the rest, delete clauses from the first half
  // Keep clauses which seem to be usefull (their lbd was reduce during this sequence)

  int limit = learnts.size() / 2;
  for (i = j = 0; i < learnts.size(); i++){
    Clause& c = ca[learnts[i]];
    if (c.lbd()>2 && c.size() > 2 && c.canBeDel() &&  !locked(c) && (i < limit)) {
      removeClause(learnts[i]);
      nbRemovedClauses++;
    }
    else {
      if(!c.canBeDel()) limit++; //we keep c, so we can delete an other clause
      c.setCanBeDel(true);       // At the next step, c can be delete
      learnts[j++] = learnts[i];
    }
  }
  learnts.shrink(i - j);
  checkGarbage();
}